

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall
stringToUnits_NumericalMultipliers_Test::~stringToUnits_NumericalMultipliers_Test
          (stringToUnits_NumericalMultipliers_Test *this)

{
  stringToUnits_NumericalMultipliers_Test *this_local;
  
  ~stringToUnits_NumericalMultipliers_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(stringToUnits, NumericalMultipliers)
{
    EXPECT_EQ(precise::km, unit_from_string("1000*m"));
    EXPECT_EQ(precise::mm, unit_from_string("km*1e-6"));
    EXPECT_EQ(precise::km, unit_from_string("1e3*0.001*1e6/1e3*m"));
    EXPECT_EQ(precise_unit(0.7564, precise::kg), unit_from_string("0.7564*kg"));
    EXPECT_EQ(precise::km, unit_from_string("1000m"));
    EXPECT_EQ(
        precise::kilo * precise::kg / precise::m,
        unit_from_string("1e3*0.001*1e6kg/1e3m"));
    EXPECT_EQ(precise_unit(0.7564, precise::kg), unit_from_string("0.7564kg"));
}